

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void Internal_WeldAndAddNgon
               (ON_Mesh *mesh,ON_MeshTopology *top,uchar xmark,uchar *fmarks,
               ON_SimpleArray<unsigned_int> *ngon_fi)

{
  ulong uVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint Fcount;
  uint uVar11;
  long lVar12;
  ON_MeshTopologyFace *pOVar13;
  ON_MeshFace *pOVar14;
  ON_MeshTopologyVertex *pOVar15;
  ON_MeshTopologyEdge *pOVar16;
  uint *ngon_fi_00;
  int iVar17;
  uint nfi;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  int iVar22;
  undefined7 in_register_00000011;
  long lVar23;
  int pass;
  int iVar24;
  long lVar25;
  long lVar26;
  ON_MeshFace *pOVar27;
  int iVar28;
  long lVar29;
  int efi;
  long lVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  bool bVar34;
  bool bVar35;
  ON_MeshFace local_98;
  uchar *local_88;
  int *local_80;
  ON_MeshFace f [2];
  
  lVar23 = CONCAT71(in_register_00000011,xmark);
  lVar25 = (long)*(int *)(fmarks + 0x10);
  if (lVar25 < 2) {
    return;
  }
  for (lVar19 = 0; lVar12 = *(long *)(fmarks + 8), lVar25 != lVar19; lVar19 = lVar19 + 1) {
    pbVar2 = (byte *)(lVar23 + (ulong)*(uint *)(lVar12 + lVar19 * 4));
    *pbVar2 = *pbVar2 | 0x10;
  }
  pOVar13 = (top->m_topf).m_a;
  pOVar14 = (mesh->m_F).m_a;
  pOVar15 = (top->m_topv).m_a;
  pOVar16 = (top->m_tope).m_a;
  lVar19 = 0;
  do {
    if (lVar19 == lVar25) {
      for (lVar19 = 0; lVar25 != lVar19; lVar19 = lVar19 + 1) {
        pbVar2 = (byte *)(lVar23 + (ulong)*(uint *)(*(long *)(fmarks + 8) + lVar19 * 4));
        *pbVar2 = *pbVar2 & 0xef;
      }
      Fcount = *(uint *)(fmarks + 0x10);
      ngon_fi_00 = *(uint **)(fmarks + 8);
      local_88 = fmarks;
      if (Fcount == 2) {
        uVar18 = *ngon_fi_00;
        uVar11 = ngon_fi_00[1];
        if (((uVar18 != uVar11) &&
            (pOVar14 = (mesh->m_F).m_a, pOVar14[uVar18].vi[2] == pOVar14[uVar18].vi[3])) &&
           (pOVar14[uVar11].vi[2] == pOVar14[uVar11].vi[3])) {
          pOVar27 = pOVar14 + uVar18;
          f[0].vi._0_8_ = *(undefined8 *)pOVar27->vi;
          f[0].vi._8_8_ = *(undefined8 *)(pOVar27->vi + 2);
          f[1].vi._0_8_ = *(undefined8 *)pOVar14[uVar11].vi;
          f[1].vi._8_8_ = *(undefined8 *)(pOVar14[uVar11].vi + 2);
          iVar3 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          uVar1 = 0;
          while (uVar31 = uVar1, uVar31 != 3) {
            iVar4 = f[0].vi[uVar31];
            uVar1 = uVar31 + 1;
            uVar20 = uVar1 & 0xffffffff;
            if (uVar1 == 3) {
              uVar20 = 0;
            }
            iVar5 = f[0].vi[uVar20];
            uVar18 = (int)uVar31 + 2;
            lVar23 = 0;
            while (lVar25 = lVar23, lVar25 != 3) {
              lVar23 = lVar25 + 1;
              lVar19 = 0;
              if (lVar25 != 2) {
                lVar19 = lVar23;
              }
              if ((iVar4 == f[1].vi[lVar19]) && (iVar5 == f[1].vi[lVar25])) {
                local_98.vi[uVar31] = iVar4;
                uVar20 = (ulong)((int)lVar25 - 1);
                if (lVar25 == 0) {
                  uVar20 = 2;
                }
                local_98.vi[(uint)uVar1 & 3] = f[1].vi[uVar20];
                local_98.vi[uVar18 & 3] = iVar5;
                local_98.vi[(int)uVar31 - 1U & 3] = f[0].vi[(ulong)uVar18 % 3];
                if ((local_98.vi[2] != local_98.vi[3]) &&
                   (bVar34 = ON_MeshFace::IsValid(&local_98,iVar3), bVar34)) {
                  *(undefined8 *)pOVar27->vi = local_98.vi._0_8_;
                  *(ulong *)(pOVar27->vi + 2) = CONCAT44(local_98.vi[3],local_98.vi[2]);
                  pOVar14 = (mesh->m_F).m_a + *(uint *)(*(long *)(local_88 + 8) + 4);
                  pOVar14->vi[0] = -1;
                  pOVar14->vi[1] = -1;
                  pOVar14->vi[2] = -1;
                  pOVar14->vi[3] = -1;
                  if (0 < *(int *)(local_88 + 0x14)) {
                    local_88[0x10] = '\x01';
                    local_88[0x11] = '\0';
                    local_88[0x12] = '\0';
                    local_88[0x13] = '\0';
                  }
                  ON_Mesh::AddNgon(mesh,1,*(uint **)(local_88 + 8));
                  return;
                }
              }
            }
          }
        }
      }
      ON_Mesh::AddNgon(mesh,Fcount,ngon_fi_00);
      return;
    }
    iVar4 = *(int *)(lVar12 + lVar19 * 4);
    iVar5 = pOVar13[iVar4].m_topei[2];
    iVar3 = pOVar13[iVar4].m_topei[3];
    iVar6 = pOVar13[iVar4].m_topei[1];
    iVar7 = pOVar13[iVar4].m_topei[0];
    for (lVar29 = 0; lVar29 != 4 - (ulong)(iVar7 != iVar6 && iVar5 == iVar3); lVar29 = lVar29 + 1) {
      iVar8 = pOVar16[pOVar13[iVar4].m_topei[lVar29]].m_topvi[pOVar13[iVar4].m_reve[lVar29] == '\0']
      ;
      if ((1 < pOVar15[iVar8].m_v_count) && (pOVar15[iVar8].m_vi != (int *)0x0)) {
        local_80 = pOVar14[iVar4].vi + lVar29;
        iVar28 = *local_80;
        iVar33 = iVar28;
        for (iVar24 = 0; iVar24 != 2; iVar24 = iVar24 + 1) {
          for (iVar22 = 0; iVar22 < pOVar15[iVar8].m_v_count; iVar22 = iVar22 + 1) {
            iVar9 = pOVar13[iVar4].m_topei[lVar29];
            for (lVar30 = 0; lVar30 < pOVar16[iVar9].m_topf_count; lVar30 = lVar30 + 1) {
              lVar32 = (long)pOVar16[iVar9].m_topfi[lVar30];
              if ((iVar4 != pOVar16[iVar9].m_topfi[lVar30]) && (*(char *)(lVar23 + lVar32) != '\0'))
              {
                bVar34 = pOVar13[lVar32].m_topei[2] == pOVar13[lVar32].m_topei[3];
                bVar35 = pOVar13[lVar32].m_topei[0] != pOVar13[lVar32].m_topei[1];
                for (lVar26 = 0; 4 - (ulong)(bVar35 && bVar34) != lVar26; lVar26 = lVar26 + 1) {
                  iVar17 = iVar28;
                  if (iVar8 == pOVar16[pOVar13[lVar32].m_topei[lVar26]].m_topvi
                               [pOVar13[lVar32].m_reve[lVar26] == '\0']) {
                    if (iVar24 == 0) {
                      iVar10 = pOVar14[lVar32].vi[lVar26];
                      iVar17 = iVar10;
                      if ((iVar28 <= iVar10) && (iVar17 = iVar28, iVar33 < iVar10)) {
                        iVar33 = iVar10;
                      }
                    }
                    else if ((lVar26 == 2) && (pOVar14[lVar32].vi[2] == pOVar14[lVar32].vi[3])) {
                      pOVar14[lVar32].vi[2] = iVar28;
                      pOVar14[lVar32].vi[3] = iVar28;
                    }
                    else {
                      pOVar14[lVar32].vi[lVar26] = iVar28;
                    }
                  }
                  iVar28 = iVar17;
                }
                if (bVar35 && bVar34) {
                  pOVar14[lVar32].vi[3] = pOVar14[lVar32].vi[2];
                }
              }
            }
          }
          if (iVar24 == 0) {
            if (iVar28 == iVar33) break;
          }
          else {
            piVar21 = local_80;
            if ((lVar29 == 2) && (pOVar14[iVar4].vi[2] == pOVar14[iVar4].vi[3])) {
              pOVar14[iVar4].vi[2] = iVar28;
              piVar21 = pOVar14[iVar4].vi + 3;
            }
            *piVar21 = iVar28;
          }
        }
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

static void Internal_WeldAndAddNgon(
  ON_Mesh& mesh,
  const ON_MeshTopology& top,
  const unsigned char xmark,
  unsigned char* fmarks,
   ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() < 2)
    return;

  // ngons must be welded and MergeFaces supports making an ngon across an unwelded edge.
  Internal_WeldNgonCandiate(mesh,top,fmarks,xmark,ngon_fi);

  if (
    2 == ngon_fi.Count() 
    &&ngon_fi[0] != ngon_fi[1]
    && mesh.m_F[ngon_fi[0]].IsTriangle() 
    && mesh.m_F[ngon_fi[1]].IsTriangle()
    )
  {
    // make a single quad face
    ON_MeshFace f[2] = {mesh.m_F[ngon_fi[0]],mesh.m_F[ngon_fi[1]]};
    for (int f0ei = 0; f0ei < 3; ++f0ei)
    {
      const int f0vi[2] = { f[0].vi[f0ei],f[0].vi[(f0ei + 1) % 3] };
      for (int f1ei = 0; f1ei < 3; ++f1ei)
      {
        const int f1vi[2] = { f[1].vi[f1ei],f[1].vi[(f1ei + 1) % 3] };
        if (f0vi[0] != f1vi[1] || f0vi[1] != f1vi[0])
          continue;
        // merge triangles into a quad
        ON_MeshFace q;
        q.vi[f0ei] = f[0].vi[f0ei];
        q.vi[(f0ei+1)%4] = f[1].vi[(f1ei+2)%3];
        q.vi[(f0ei+2)%4] = f[0].vi[(f0ei+1)%3];
        q.vi[(f0ei+3)%4] = f[0].vi[(f0ei+2)%3];
        if (q.IsQuad() && q.IsValid(mesh.m_V.Count()))
        {
          mesh.m_F[ngon_fi[0]] = q;
          q.vi[0] = -1;
          q.vi[1] = -1;
          q.vi[2] = -1;
          q.vi[3] = -1;
          mesh.m_F[ngon_fi[1]] = q;
          ngon_fi.SetCount(1);
          mesh.AddNgon(1, ngon_fi.Array());
          return;
        }
      }
    }
  }

  mesh.AddNgon(ngon_fi.UnsignedCount(), ngon_fi.Array());
}